

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

string * __thiscall
Parameter<unsigned_long>::getParamType_abi_cxx11_
          (string *__return_storage_ptr__,Parameter<unsigned_long> *this)

{
  ParameterTraits<unsigned_long>::getParamType_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getParamType() {
    return ParameterTraits<ParamType>::getParamType();
  }